

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int archive_read_format_iso9660_read_header(archive_read *a,archive_entry *entry)

{
  int iVar1;
  iso9660 *iso9660;
  content *pcVar2;
  uint uVar3;
  int iVar4;
  wchar_t wVar5;
  mode_t mVar6;
  ulong uVar7;
  archive_string_conv *paVar8;
  uchar *puVar9;
  uchar *puVar10;
  int *piVar11;
  ulong uVar12;
  file_info *pfVar13;
  uint64_t uVar14;
  size_t n;
  bool bVar15;
  file_info *in_RCX;
  char *pcVar16;
  char cVar17;
  long lVar18;
  file_info *file;
  file_info *local_38;
  
  iso9660 = (iso9660 *)a->format->data;
  if ((a->archive).archive_format == 0) {
    (a->archive).archive_format = 0x40000;
    (a->archive).archive_format_name = "ISO9660";
  }
  if (iso9660->current_position == 0) {
    if (iso9660->opt_support_joliet == 0) {
      iso9660->seenJoliet = '\0';
LAB_004e53c3:
      lVar18 = 0xbc;
      bVar15 = true;
    }
    else {
      if (iso9660->seenJoliet == '\0') goto LAB_004e53c3;
      iVar1 = (iso9660->primary).location;
      iVar4 = (iso9660->joliet).location;
      bVar15 = iVar1 <= iVar4;
      lVar18 = (ulong)(iVar4 < iVar1) * 8 + 0xbc;
    }
    uVar12 = __archive_read_consume(a,(long)*(int *)((long)&iso9660->magic + lVar18) << 0xb);
    if ((long)uVar12 < 0) {
LAB_004e54c2:
      uVar7 = uVar12 & 0xffffffff;
      if ((int)uVar12 != 0) goto LAB_004e58d6;
      goto LAB_004e5213;
    }
    iso9660->current_position = uVar12;
    puVar9 = (uchar *)__archive_read_ahead
                                (a,(ulong)*(uint *)((long)&iso9660->opt_support_joliet + lVar18),
                                 (ssize_t *)0x0);
    if (puVar9 != (uchar *)0x0) {
      cVar17 = iso9660->seenJoliet;
      iso9660->seenJoliet = '\0';
      pfVar13 = parse_file_info(a,(file_info *)0x0,puVar9);
      uVar7 = 0xffffffe2;
      if (pfVar13 == (file_info *)0x0) goto LAB_004e58d6;
      iso9660->seenJoliet = cVar17;
      if (bVar15) {
        if (cVar17 == '\0' || iso9660->seenRockridge == '\0') {
          bVar15 = iso9660->seenRockridge != '\0' || cVar17 == '\0';
          in_RCX = (file_info *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar15);
          if (bVar15) goto LAB_004e57ac;
          uVar12 = __archive_read_consume
                             (a,(long)(iso9660->joliet).location * 0x800 - iso9660->current_position
                             );
          if ((long)uVar12 < 0) goto LAB_004e54c2;
          iso9660->current_position = iso9660->current_position + uVar12;
          puVar9 = (uchar *)__archive_read_ahead(a,(ulong)(iso9660->joliet).size,(ssize_t *)0x0);
          if (puVar9 == (uchar *)0x0) {
            archive_set_error(&a->archive,-1,
                              "Failed to read full block when scanning ISO9660 directory list");
            goto LAB_004e58d6;
          }
          iso9660->seenJoliet = '\0';
          pfVar13 = parse_file_info(a,(file_info *)0x0,puVar9);
          if (pfVar13 == (file_info *)0x0) goto LAB_004e58d6;
        }
        else {
          cVar17 = '\0';
        }
        iso9660->seenJoliet = cVar17;
      }
LAB_004e57ac:
      in_RCX = (file_info *)pfVar13->offset;
      iVar4 = heap_add_entry(a,&iso9660->pending_files,pfVar13,(uint64_t)in_RCX);
      if (iVar4 != 0) goto LAB_004e58d6;
      if (iso9660->seenRockridge != '\0') {
        (a->archive).archive_format = 0x40001;
        (a->archive).archive_format_name = "ISO9660 with Rockridge extensions";
      }
      goto LAB_004e5213;
    }
    pcVar16 = "Failed to read full block when scanning ISO9660 directory list";
    iVar4 = -1;
LAB_004e55d2:
    archive_set_error(&a->archive,iVar4,pcVar16);
  }
  else {
LAB_004e5213:
    local_38 = (file_info *)0x0;
    uVar3 = next_cache_entry(a,iso9660,&local_38);
    pfVar13 = local_38;
    uVar7 = (ulong)uVar3;
    if (uVar3 != 0) goto LAB_004e58d6;
    if (local_38->size == 0) {
      local_38->offset = iso9660->current_position;
    }
    if (iso9660->entry_bytes_unconsumed != 0) {
      __archive_read_consume(a,iso9660->entry_bytes_unconsumed);
      iso9660->entry_bytes_unconsumed = 0;
    }
    lVar18 = pfVar13->offset - iso9660->current_position;
    if (iso9660->current_position <= pfVar13->offset && lVar18 != 0) {
      uVar7 = __archive_read_consume(a,lVar18);
      if ((long)uVar7 < 0) {
        if ((int)uVar7 != 0) goto LAB_004e58d6;
      }
      else {
        iso9660->current_position = pfVar13->offset;
      }
    }
    if (iso9660->seenJoliet == '\0') {
      (iso9660->pathname).length = 0;
      pcVar16 = build_pathname(&iso9660->pathname,pfVar13);
      archive_entry_set_pathname(entry,pcVar16);
LAB_004e54f1:
      uVar7 = 0;
LAB_004e54f4:
      uVar14 = pfVar13->size;
      iso9660->entry_bytes_remaining = uVar14;
      iso9660->entry_sparse_offset = 0;
      if (iso9660->volume_size < uVar14 + pfVar13->offset) {
        pcVar16 = archive_entry_pathname(entry);
        archive_set_error(&a->archive,-1,"File is beyond end-of-media: %s",pcVar16);
LAB_004e5538:
        iso9660->entry_bytes_remaining = 0;
        uVar7 = 0xffffffec;
      }
      else {
        archive_entry_set_mode(entry,pfVar13->mode);
        archive_entry_set_uid(entry,(ulong)pfVar13->uid);
        archive_entry_set_gid(entry,(ulong)pfVar13->gid);
        archive_entry_set_nlink(entry,pfVar13->nlinks);
        if (pfVar13->birthtime_is_set == 0) {
          archive_entry_unset_birthtime(entry);
        }
        else {
          archive_entry_set_birthtime(entry,pfVar13->birthtime,0);
        }
        archive_entry_set_mtime(entry,pfVar13->mtime,0);
        archive_entry_set_ctime(entry,pfVar13->ctime,0);
        archive_entry_set_atime(entry,pfVar13->atime,0);
        archive_entry_set_rdev(entry,pfVar13->rdev);
        archive_entry_set_size(entry,iso9660->entry_bytes_remaining);
        pcVar16 = (pfVar13->symlink).s;
        if (pcVar16 != (char *)0x0) {
          archive_entry_copy_symlink(entry,pcVar16);
        }
        if ((pfVar13->number == -1) || (pfVar13->number != iso9660->previous_number)) {
          if (((pfVar13->mode & 0xf000) != 0x4000) && (pfVar13->offset < iso9660->current_position))
          {
            uVar14 = __archive_read_seek(a,pfVar13->offset,0);
            if (uVar14 != pfVar13->offset) {
              archive_set_error(&a->archive,-1,"Ignoring out-of-order file @%jx (%s) %jd < %jd",
                                pfVar13->number,(iso9660->pathname).s,pfVar13->offset,
                                iso9660->current_position);
              goto LAB_004e5538;
            }
            iso9660->current_position = uVar14;
          }
          iVar4 = pfVar13->pz;
          (iso9660->entry_zisofs).pz = iVar4;
          if (iVar4 != 0) {
            (iso9660->entry_zisofs).initialized = 0;
            (iso9660->entry_zisofs).pz_log2_bs = pfVar13->pz_log2_bs;
            uVar14 = pfVar13->pz_uncompressed_size;
            (iso9660->entry_zisofs).pz_uncompressed_size = uVar14;
            (iso9660->entry_zisofs).pz_offset = 0;
            (iso9660->entry_zisofs).header_avail = 0;
            (iso9660->entry_zisofs).header_passed = 0;
            (iso9660->entry_zisofs).block_pointers_avail = 0;
            archive_entry_set_size(entry,uVar14);
          }
          iso9660->previous_number = pfVar13->number;
          if (iso9660->seenJoliet == '\0') {
            (iso9660->previous_pathname).length = 0;
            pcVar16 = (iso9660->pathname).s;
            if (pcVar16 == (char *)0x0) {
              n = 0;
            }
            else {
              n = strlen(pcVar16);
            }
            archive_strncat(&iso9660->previous_pathname,pcVar16,n);
          }
          else {
            memcpy(iso9660->utf16be_previous_path,iso9660->utf16be_path,iso9660->utf16be_path_len);
            iso9660->utf16be_previous_path_len = iso9660->utf16be_path_len;
          }
          pcVar2 = (pfVar13->contents).first;
          iso9660->entry_content = pcVar2;
          if (pcVar2 != (content *)0x0) {
            iso9660->entry_bytes_remaining = pcVar2->size;
          }
          mVar6 = archive_entry_filetype(entry);
          if (mVar6 != 0x4000) goto LAB_004e58d6;
          archive_entry_set_nlink(entry,pfVar13->subdirs + 2);
        }
        else {
          if (iso9660->seenJoliet == '\0') {
            archive_entry_set_hardlink(entry,(iso9660->previous_pathname).s);
          }
          else {
            wVar5 = _archive_entry_copy_hardlink_l
                              (entry,(char *)iso9660->utf16be_previous_path,
                               iso9660->utf16be_previous_path_len,iso9660->sconv_utf16be);
            if (wVar5 != L'\0') {
              piVar11 = __errno_location();
              if (*piVar11 == 0xc) {
                pcVar16 = "No memory for Linkname";
                goto LAB_004e55ca;
              }
              pcVar16 = archive_string_conversion_charset_name(iso9660->sconv_utf16be);
              archive_set_error(&a->archive,0x54,
                                "Linkname cannot be converted from %s to current locale.",pcVar16);
              uVar7 = 0xffffffec;
            }
          }
          archive_entry_unset_size(entry);
        }
        iso9660->entry_bytes_remaining = 0;
      }
      goto LAB_004e58d6;
    }
    if (iso9660->sconv_utf16be != (archive_string_conv *)0x0) {
LAB_004e52cc:
      puVar9 = iso9660->utf16be_path;
      if (puVar9 == (uchar *)0x0) {
        puVar9 = (uchar *)malloc(0x400);
        iso9660->utf16be_path = puVar9;
        if (puVar9 != (uchar *)0x0) goto LAB_004e52f5;
LAB_004e55c3:
        pcVar16 = "No memory";
      }
      else {
LAB_004e52f5:
        if (iso9660->utf16be_previous_path == (uchar *)0x0) {
          puVar10 = (uchar *)malloc(0x400);
          iso9660->utf16be_previous_path = puVar10;
          if (puVar10 == (uchar *)0x0) goto LAB_004e55c3;
        }
        iso9660->utf16be_path_len = 0;
        iVar4 = build_pathname_utf16be
                          (puVar9,(size_t)&iso9660->utf16be_path_len,(size_t *)pfVar13,in_RCX);
        if (iVar4 != 0) {
          archive_set_error(&a->archive,0x54,"Pathname is too long");
        }
        wVar5 = _archive_entry_copy_pathname_l
                          (entry,(char *)iso9660->utf16be_path,iso9660->utf16be_path_len,
                           iso9660->sconv_utf16be);
        if (wVar5 == L'\0') goto LAB_004e54f1;
        piVar11 = __errno_location();
        if (*piVar11 != 0xc) {
          pcVar16 = archive_string_conversion_charset_name(iso9660->sconv_utf16be);
          archive_set_error(&a->archive,0x54,
                            "Pathname cannot be converted from %s to current locale.",pcVar16);
          uVar7 = 0xffffffec;
          goto LAB_004e54f4;
        }
        pcVar16 = "No memory for Pathname";
      }
LAB_004e55ca:
      iVar4 = 0xc;
      goto LAB_004e55d2;
    }
    paVar8 = archive_string_conversion_from_charset(&a->archive,"UTF-16BE",L'\x01');
    iso9660->sconv_utf16be = paVar8;
    if (paVar8 != (archive_string_conv *)0x0) goto LAB_004e52cc;
  }
  uVar7 = 0xffffffe2;
LAB_004e58d6:
  return (int)uVar7;
}

Assistant:

static int
archive_read_format_iso9660_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct iso9660 *iso9660;
	struct file_info *file;
	int r, rd_r = ARCHIVE_OK;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (!a->archive.archive_format) {
		a->archive.archive_format = ARCHIVE_FORMAT_ISO9660;
		a->archive.archive_format_name = "ISO9660";
	}

	if (iso9660->current_position == 0) {
		r = choose_volume(a, iso9660);
		if (r != ARCHIVE_OK)
			return (r);
	}

	file = NULL;/* Eliminate a warning. */
	/* Get the next entry that appears after the current offset. */
	r = next_entry_seek(a, iso9660, &file);
	if (r != ARCHIVE_OK)
		return (r);

	if (iso9660->seenJoliet) {
		/*
		 * Convert UTF-16BE of a filename to local locale MBS
		 * and store the result into a filename field.
		 */
		if (iso9660->sconv_utf16be == NULL) {
			iso9660->sconv_utf16be =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_utf16be == NULL)
				/* Coundn't allocate memory */
				return (ARCHIVE_FATAL);
		}
		if (iso9660->utf16be_path == NULL) {
			iso9660->utf16be_path = malloc(UTF16_NAME_MAX);
			if (iso9660->utf16be_path == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
		}
		if (iso9660->utf16be_previous_path == NULL) {
			iso9660->utf16be_previous_path = malloc(UTF16_NAME_MAX);
			if (iso9660->utf16be_previous_path == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
		}

		iso9660->utf16be_path_len = 0;
		if (build_pathname_utf16be(iso9660->utf16be_path,
		    UTF16_NAME_MAX, &(iso9660->utf16be_path_len), file) != 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname is too long");
		}

		r = archive_entry_copy_pathname_l(entry,
		    (const char *)iso9660->utf16be_path,
		    iso9660->utf16be_path_len,
		    iso9660->sconv_utf16be);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Pathname cannot be converted "
			    "from %s to current locale.",
			    archive_string_conversion_charset_name(
			      iso9660->sconv_utf16be));

			rd_r = ARCHIVE_WARN;
		}
	} else {
		archive_string_empty(&iso9660->pathname);
		archive_entry_set_pathname(entry,
		    build_pathname(&iso9660->pathname, file));
	}

	iso9660->entry_bytes_remaining = file->size;
	/* Offset for sparse-file-aware clients. */
	iso9660->entry_sparse_offset = 0;

	if (file->offset + file->size > iso9660->volume_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "File is beyond end-of-media: %s",
		    archive_entry_pathname(entry));
		iso9660->entry_bytes_remaining = 0;
		return (ARCHIVE_WARN);
	}

	/* Set up the entry structure with information about this entry. */
	archive_entry_set_mode(entry, file->mode);
	archive_entry_set_uid(entry, file->uid);
	archive_entry_set_gid(entry, file->gid);
	archive_entry_set_nlink(entry, file->nlinks);
	if (file->birthtime_is_set)
		archive_entry_set_birthtime(entry, file->birthtime, 0);
	else
		archive_entry_unset_birthtime(entry);
	archive_entry_set_mtime(entry, file->mtime, 0);
	archive_entry_set_ctime(entry, file->ctime, 0);
	archive_entry_set_atime(entry, file->atime, 0);
	/* N.B.: Rock Ridge supports 64-bit device numbers. */
	archive_entry_set_rdev(entry, (dev_t)file->rdev);
	archive_entry_set_size(entry, iso9660->entry_bytes_remaining);
	if (file->symlink.s != NULL)
		archive_entry_copy_symlink(entry, file->symlink.s);

	/* Note: If the input isn't seekable, we can't rewind to
	 * return the same body again, so if the next entry refers to
	 * the same data, we have to return it as a hardlink to the
	 * original entry. */
	if (file->number != -1 &&
	    file->number == iso9660->previous_number) {
		if (iso9660->seenJoliet) {
			r = archive_entry_copy_hardlink_l(entry,
			    (const char *)iso9660->utf16be_previous_path,
			    iso9660->utf16be_previous_path_len,
			    iso9660->sconv_utf16be);
			if (r != 0) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "No memory for Linkname");
					return (ARCHIVE_FATAL);
				}
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Linkname cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
				      iso9660->sconv_utf16be));
				rd_r = ARCHIVE_WARN;
			}
		} else
			archive_entry_set_hardlink(entry,
			    iso9660->previous_pathname.s);
		archive_entry_unset_size(entry);
		iso9660->entry_bytes_remaining = 0;
		return (rd_r);
	}

	if ((file->mode & AE_IFMT) != AE_IFDIR &&
	    file->offset < iso9660->current_position) {
		int64_t r64;

		r64 = __archive_read_seek(a, file->offset, SEEK_SET);
		if (r64 != (int64_t)file->offset) {
			/* We can't seek backwards to extract it, so issue
			 * a warning.  Note that this can only happen if
			 * this entry was added to the heap after we passed
			 * this offset, that is, only if the directory
			 * mentioning this entry is later than the body of
			 * the entry. Such layouts are very unusual; most
			 * ISO9660 writers lay out and record all directory
			 * information first, then store all file bodies. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring out-of-order file @%jx (%s) %jd < %jd",
			    (intmax_t)file->number,
			    iso9660->pathname.s,
			    (intmax_t)file->offset,
			    (intmax_t)iso9660->current_position);
			iso9660->entry_bytes_remaining = 0;
			return (ARCHIVE_WARN);
		}
		iso9660->current_position = (uint64_t)r64;
	}

	/* Initialize zisofs variables. */
	iso9660->entry_zisofs.pz = file->pz;
	if (file->pz) {
#ifdef HAVE_ZLIB_H
		struct zisofs  *zisofs;

		zisofs = &iso9660->entry_zisofs;
		zisofs->initialized = 0;
		zisofs->pz_log2_bs = file->pz_log2_bs;
		zisofs->pz_uncompressed_size = file->pz_uncompressed_size;
		zisofs->pz_offset = 0;
		zisofs->header_avail = 0;
		zisofs->header_passed = 0;
		zisofs->block_pointers_avail = 0;
#endif
		archive_entry_set_size(entry, file->pz_uncompressed_size);
	}

	iso9660->previous_number = file->number;
	if (iso9660->seenJoliet) {
		memcpy(iso9660->utf16be_previous_path, iso9660->utf16be_path,
		    iso9660->utf16be_path_len);
		iso9660->utf16be_previous_path_len = iso9660->utf16be_path_len;
	} else
		archive_strcpy(
		    &iso9660->previous_pathname, iso9660->pathname.s);

	/* Reset entry_bytes_remaining if the file is multi extent. */
	iso9660->entry_content = file->contents.first;
	if (iso9660->entry_content != NULL)
		iso9660->entry_bytes_remaining = iso9660->entry_content->size;

	if (archive_entry_filetype(entry) == AE_IFDIR) {
		/* Overwrite nlinks by proper link number which is
		 * calculated from number of sub directories. */
		archive_entry_set_nlink(entry, 2 + file->subdirs);
		/* Directory data has been read completely. */
		iso9660->entry_bytes_remaining = 0;
	}

	if (rd_r != ARCHIVE_OK)
		return (rd_r);
	return (ARCHIVE_OK);
}